

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::LayoutBindingRenderCase
          (LayoutBindingRenderCase *this,Context *context,char *name,char *desc,
          ShaderType shaderType,TestType testType,GLenum maxBindingPointEnum,
          GLenum maxVertexUnitsEnum,GLenum maxFragmentUnitsEnum,GLenum maxCombinedUnitsEnum,
          string *uniformName)

{
  TestType testType_local;
  ShaderType shaderType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  LayoutBindingRenderCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LayoutBindingRenderCase_032c0de8;
  this->m_program = (ShaderProgram *)0x0;
  this->m_shaderType = shaderType;
  this->m_testType = testType;
  std::__cxx11::string::string((string *)&this->m_uniformName,(string *)uniformName);
  this->m_maxBindingPointEnum = maxBindingPointEnum;
  this->m_maxVertexUnitsEnum = maxVertexUnitsEnum;
  this->m_maxFragmentUnitsEnum = maxFragmentUnitsEnum;
  this->m_maxCombinedUnitsEnum = maxCombinedUnitsEnum;
  this->m_vertexBuffer = 0;
  this->m_indexBuffer = 0;
  this->m_shaderProgramLoc = 0;
  this->m_shaderProgramPosLoc = 0;
  this->m_shaderProgramArrayNdxLoc = 0;
  this->m_numBindings = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_bindings);
  return;
}

Assistant:

LayoutBindingRenderCase::LayoutBindingRenderCase (Context&				context,
												  const char*			name,
												  const char*			desc,
												  ShaderType			shaderType,
												  TestType				testType,
												  glw::GLenum			maxBindingPointEnum,
												  glw::GLenum			maxVertexUnitsEnum,
												  glw::GLenum			maxFragmentUnitsEnum,
												  glw::GLenum			maxCombinedUnitsEnum,
												  const std::string&	uniformName)
	: TestCase						(context, name, desc)
	, m_program						(DE_NULL)
	, m_shaderType					(shaderType)
	, m_testType					(testType)
	, m_uniformName					(uniformName)
	, m_maxBindingPointEnum			(maxBindingPointEnum)
	, m_maxVertexUnitsEnum			(maxVertexUnitsEnum)
	, m_maxFragmentUnitsEnum		(maxFragmentUnitsEnum)
	, m_maxCombinedUnitsEnum		(maxCombinedUnitsEnum)
	, m_vertexBuffer				(0)
	, m_indexBuffer					(0)
	, m_shaderProgramLoc			(0)
	, m_shaderProgramPosLoc			(0)
	, m_shaderProgramArrayNdxLoc	(0)
	, m_numBindings					(0)
{
}